

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff70;
  TPZGeoPrism *in_stack_ffffffffffffff80;
  int *local_60;
  TPZGeoElSideIndex local_40;
  int local_28;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoPrism>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02447350);
  TPZGeoEl::TPZGeoEl(in_RDI,&PTR_PTR_02447338);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02447038;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02447038;
  pzgeom::TPZGeoPrism::TPZGeoPrism(in_stack_ffffffffffffff80);
  local_60 = &in_RDI[1].fNumInterfaces;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    local_60 = local_60 + 6;
  } while ((int64_t *)local_60 != &in_RDI[9].fIndex);
  for (local_28 = 0; local_28 < 0x15; local_28 = local_28 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff70);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[1].fNumInterfaces + (long)local_28 * 6),&local_40);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1bba195);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}